

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O1

CURLcode pop3_statemach_act(connectdata *conn)

{
  anon_union_264_9_0449b319_for_proto *pp;
  uint *puVar1;
  byte *pbVar2;
  curl_usessl cVar3;
  int *piVar4;
  _Bool _Var5;
  CURLcode CVar6;
  imapstate iVar7;
  size_t sVar8;
  long lVar9;
  char *__dest;
  long lVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  curl_socket_t sockfd;
  char *pcVar14;
  SessionHandle *pSVar15;
  CURLcode CVar16;
  pop3_conn *pop3c;
  int pop3code;
  char *initresp;
  char *mech;
  size_t len;
  pop3state state1;
  size_t nread;
  uint local_6c;
  char *local_68;
  curl_socket_t local_5c;
  char *local_58;
  char *local_50;
  pop3state local_44;
  size_t local_40 [2];
  
  sockfd = conn->sock[0];
  local_40[1] = 0;
  CVar6 = CURLE_NOT_BUILT_IN;
  if ((conn->proto).imapc.state != IMAP_UPGRADETLS) {
    pp = &conn->proto;
    if ((conn->proto).ftpc.pp.sendleft != 0) {
      CVar6 = Curl_pp_flushsend(&(pp->ftpc).pp);
      return CVar6;
    }
    do {
      CVar6 = Curl_pp_readresp(sockfd,&(pp->ftpc).pp,(int *)&local_6c,local_40 + 1);
      uVar12 = local_6c;
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      if (local_6c == 0) {
        return CURLE_OK;
      }
      switch((conn->proto).imapc.state) {
      case IMAP_SERVERGREET:
        pSVar15 = conn->data;
        local_5c = sockfd;
        sVar8 = strlen((pSVar15->state).buffer);
        if (uVar12 == 0x2b) {
          if (((3 < sVar8) && (3 < sVar8 - 2)) && ((pSVar15->state).buffer[sVar8 - 2] == '>')) {
            pcVar14 = (pSVar15->state).buffer + 3;
            do {
              if (*pcVar14 == '<') {
                if (sVar8 != 4) {
                  __dest = (char *)(*Curl_ccalloc)(1,sVar8 - 3);
                  (conn->proto).imapc.mailbox_uidvalidity = __dest;
                  if (__dest != (char *)0x0) {
                    memcpy(__dest,pcVar14,sVar8 - 4);
                    (conn->proto).imapc.mailbox_uidvalidity[sVar8 - 4] = '\0';
                    pbVar2 = (byte *)((long)&conn->proto + 0x88);
                    *pbVar2 = *pbVar2 | 2;
                  }
                }
                break;
              }
              pcVar14 = pcVar14 + 1;
              sVar8 = sVar8 - 1;
            } while (sVar8 != 5);
          }
          (conn->proto).pop3c.authmechs = 0;
          (conn->proto).pop3c.authused = 0;
          (conn->proto).pop3c.tls_supported = false;
          CVar6 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","CAPA");
          sockfd = local_5c;
          if (CVar6 == CURLE_OK) {
            (conn->proto).imapc.state = IMAP_CAPABILITY;
          }
        }
        else {
          Curl_failf(pSVar15,"Got unexpected pop3-server response");
          CVar6 = CURLE_FTP_WEIRD_SERVER_REPLY;
          sockfd = local_5c;
        }
        break;
      case IMAP_CAPABILITY:
        pSVar15 = conn->data;
        pcVar14 = (pSVar15->state).buffer;
        local_5c = sockfd;
        sVar8 = strlen(pcVar14);
        sockfd = local_5c;
        if (uVar12 == 0x2b) {
          cVar3 = (pSVar15->set).use_ssl;
          if ((cVar3 == CURLUSESSL_NONE) || (conn->ssl[0].use != false)) {
LAB_0048854a:
            CVar6 = pop3_perform_authentication(conn);
          }
          else if ((conn->proto).pop3c.tls_supported == true) {
            CVar6 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","STLS");
            if (CVar6 == CURLE_OK) {
              (conn->proto).imapc.state = IMAP_STARTTLS;
            }
          }
          else {
            if (cVar3 == CURLUSESSL_TRY) goto LAB_0048854a;
            Curl_failf(pSVar15,"STLS not supported.");
            CVar6 = CURLE_USE_SSL_FAILED;
          }
        }
        else if (uVar12 == 0x2a) {
          if (sVar8 < 4) {
LAB_00487f27:
            CVar6 = CURLE_OK;
            CVar16 = CURLE_OK;
            if ((4 < sVar8) && ((pSVar15->state).buffer[4] == ' ' && *(int *)pcVar14 == 0x4c534153))
            {
              pbVar2 = (byte *)((long)&conn->proto + 0x88);
              *pbVar2 = *pbVar2 | 4;
              lVar9 = sVar8 - 5;
              CVar6 = CVar16;
              if (lVar9 != 0) {
                pcVar14 = (pSVar15->state).buffer + 5;
                do {
                  while ((0x20 < (ulong)(byte)*pcVar14 ||
                         ((0x100002600U >> ((ulong)(byte)*pcVar14 & 0x3f) & 1) == 0))) {
                    lVar13 = lVar9 + (ulong)(lVar9 == 0);
                    lVar10 = 0;
                    do {
                      if (((ulong)(byte)pcVar14[lVar10] < 0x21) &&
                         (lVar11 = lVar10,
                         (0x100002600U >> ((ulong)(byte)pcVar14[lVar10] & 0x3f) & 1) != 0)) break;
                      lVar10 = lVar10 + 1;
                      lVar11 = lVar13;
                    } while (lVar13 != lVar10);
                    if (lVar11 == 5) {
                      if (pcVar14[4] == 0x4e && *(int *)pcVar14 == 0x49474f4c) {
                        uVar12 = 1;
                      }
                      else {
                        if (pcVar14[4] != 0x4e || *(int *)pcVar14 != 0x49414c50) goto LAB_00487ffd;
                        uVar12 = 2;
                      }
LAB_004880e5:
                      puVar1 = &(conn->proto).pop3c.authmechs;
                      *puVar1 = *puVar1 | uVar12;
                    }
                    else {
LAB_00487ffd:
                      if ((lVar11 == 8) && (*(long *)pcVar14 == 0x35444d2d4d415243)) {
                        uVar12 = 4;
                        goto LAB_004880e5;
                      }
                      if (lVar11 == 6) {
                        if (*(short *)(pcVar14 + 4) != 0x4950 || *(int *)pcVar14 != 0x41535347)
                        goto LAB_00488066;
                        uVar12 = 0x10;
                        goto LAB_004880e5;
                      }
                      if ((lVar11 == 10) &&
                         (*(short *)(pcVar14 + 8) == 0x3544 &&
                          *(long *)pcVar14 == 0x4d2d545345474944)) {
                        uVar12 = 8;
                        goto LAB_004880e5;
                      }
LAB_00488066:
                      if ((lVar11 == 8) && (*(long *)pcVar14 == 0x4c414e5245545845)) {
                        uVar12 = 0x20;
                        goto LAB_004880e5;
                      }
                      if (lVar11 == 7) {
                        if (*(int *)(pcVar14 + 3) == 0x32485455 && *(int *)pcVar14 == 0x55414f58) {
                          uVar12 = 0x80;
                          goto LAB_004880e5;
                        }
                      }
                      else if ((lVar11 == 4) && (*(int *)pcVar14 == 0x4d4c544e)) {
                        uVar12 = 0x40;
                        goto LAB_004880e5;
                      }
                    }
                    pcVar14 = pcVar14 + lVar11;
                    lVar9 = lVar9 - lVar11;
                    if (lVar9 == 0) goto LAB_0048879d;
                  }
                  pcVar14 = pcVar14 + 1;
                  lVar9 = lVar9 + -1;
                } while (lVar9 != 0);
              }
            }
          }
          else {
            if (*(int *)pcVar14 == 0x534c5453) {
              (conn->proto).pop3c.tls_supported = true;
            }
            else {
              if (*(int *)pcVar14 != 0x52455355) goto LAB_00487f27;
              pbVar2 = (byte *)((long)&conn->proto + 0x88);
              *pbVar2 = *pbVar2 | 1;
            }
            CVar6 = CURLE_OK;
          }
        }
        else {
          pbVar2 = (byte *)((long)&conn->proto + 0x88);
          *pbVar2 = *pbVar2 | 1;
          CVar6 = pop3_perform_authentication(conn);
          sockfd = local_5c;
        }
        break;
      case IMAP_STARTTLS:
        CVar6 = CURLE_NOT_BUILT_IN;
        if (local_6c != 0x2b) {
          if ((conn->data->set).use_ssl == CURLUSESSL_TRY) {
            CVar6 = pop3_perform_authentication(conn);
          }
          else {
            Curl_failf(conn->data,"STARTTLS denied. %c",(ulong)local_6c);
            CVar6 = CURLE_USE_SSL_FAILED;
          }
        }
        break;
      default:
        goto switchD_00487d24_caseD_4;
      case IMAP_AUTHENTICATE_PLAIN:
        pSVar15 = conn->data;
        local_58 = (char *)0x0;
        local_68 = (char *)0x0;
        if (local_6c == 0x2b) {
          CVar6 = Curl_sasl_create_plain_message
                            (pSVar15,conn->user,conn->passwd,&local_68,(size_t *)&local_58);
          goto LAB_004883eb;
        }
        pcVar14 = "Access denied. %c";
LAB_004884f9:
        local_58 = (char *)0x0;
        local_68 = (char *)0x0;
        Curl_failf(pSVar15,pcVar14,(ulong)local_6c);
        CVar6 = CURLE_LOGIN_DENIED;
        goto LAB_00488509;
      case IMAP_AUTHENTICATE_LOGIN:
        pSVar15 = conn->data;
        local_58 = (char *)0x0;
        local_68 = (char *)0x0;
        if (local_6c != 0x2b) {
LAB_0048842a:
          pcVar14 = "Access denied: %d";
          goto LAB_004884f9;
        }
        CVar6 = Curl_sasl_create_login_message(pSVar15,conn->user,&local_68,(size_t *)&local_58);
        if ((local_68 == (char *)0x0 || CVar6 != CURLE_OK) ||
           (CVar6 = Curl_pp_sendf(&(pp->ftpc).pp,"%s"), CVar6 != CURLE_OK)) goto LAB_00488509;
        (conn->proto).imapc.state = IMAP_AUTHENTICATE_LOGIN_PASSWD;
        goto LAB_00488640;
      case IMAP_AUTHENTICATE_LOGIN_PASSWD:
        pSVar15 = conn->data;
        local_58 = (char *)0x0;
        local_68 = (char *)0x0;
        if (local_6c != 0x2b) goto LAB_0048842a;
        CVar6 = Curl_sasl_create_login_message(pSVar15,conn->passwd,&local_68,(size_t *)&local_58);
        goto LAB_004883eb;
      case IMAP_AUTHENTICATE_CRAMMD5:
        pSVar15 = conn->data;
        local_58 = (char *)0x0;
        local_68 = (char *)0x0;
        local_50 = (char *)0x0;
        local_40[0] = 0;
        if (local_6c == 0x2b) {
          pop3_get_message((pSVar15->state).buffer,&local_68);
          CVar6 = Curl_sasl_decode_cram_md5_message(local_68,&local_58,local_40);
          if (CVar6 == CURLE_OK) {
            CVar6 = Curl_sasl_create_cram_md5_message
                              (pSVar15,local_58,conn->user,conn->passwd,&local_50,local_40);
            if ((local_50 != (char *)0x0 && CVar6 == CURLE_OK) &&
               (CVar6 = Curl_pp_sendf(&(pp->ftpc).pp,"%s"), CVar6 == CURLE_OK)) {
              iVar7 = IMAP_AUTHENTICATE_FINAL;
              goto LAB_004887e0;
            }
          }
          else {
            CVar6 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","*");
            if (CVar6 == CURLE_OK) {
              iVar7 = IMAP_AUTHENTICATE_CANCEL;
LAB_004887e0:
              (conn->proto).imapc.state = iVar7;
              CVar6 = CURLE_OK;
            }
          }
          if (local_58 != (char *)0x0) {
            (*Curl_cfree)(local_58);
            local_58 = (char *)0x0;
          }
          if (local_50 != (char *)0x0) {
            (*Curl_cfree)(local_50);
            local_50 = (char *)0x0;
          }
        }
        else {
LAB_00488220:
          local_50 = (char *)0x0;
          local_58 = (char *)0x0;
          local_68 = (char *)0x0;
          Curl_failf(pSVar15,"Access denied: %d",(ulong)local_6c);
LAB_00488234:
          CVar6 = CURLE_LOGIN_DENIED;
        }
        break;
      case IMAP_AUTHENTICATE_DIGESTMD5:
        pSVar15 = conn->data;
        local_58 = (char *)0x0;
        local_68 = (char *)0x0;
        local_50 = (char *)0x0;
        if (local_6c != 0x2b) goto LAB_00488220;
        pop3_get_message((pSVar15->state).buffer,&local_58);
        CVar6 = Curl_sasl_create_digest_md5_message
                          (pSVar15,local_58,conn->user,conn->passwd,"pop",&local_68,
                           (size_t *)&local_50);
        if (CVar6 == CURLE_OK) {
          CVar6 = Curl_pp_sendf(&(pp->ftpc).pp,"%s",local_68);
          if (CVar6 == CURLE_OK) {
            iVar7 = IMAP_AUTHENTICATE_DIGESTMD5_RESP;
            goto LAB_0048863a;
          }
        }
        else if ((CVar6 == CURLE_BAD_CONTENT_ENCODING) &&
                (CVar6 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","*"), CVar6 == CURLE_OK)) {
          iVar7 = IMAP_AUTHENTICATE_CANCEL;
LAB_0048863a:
          (conn->proto).imapc.state = iVar7;
          goto LAB_00488640;
        }
        goto LAB_00488509;
      case IMAP_AUTHENTICATE_DIGESTMD5_RESP:
        if (local_6c != 0x2b) {
LAB_00488464:
          pSVar15 = conn->data;
          pcVar14 = "Authentication failed: %d";
LAB_004884c8:
          Curl_failf(pSVar15,pcVar14,(ulong)local_6c);
          CVar6 = CURLE_LOGIN_DENIED;
          break;
        }
        CVar6 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","");
        if (CVar6 != CURLE_OK) break;
        (conn->proto).imapc.state = IMAP_AUTHENTICATE_FINAL;
        goto LAB_00488253;
      case IMAP_AUTHENTICATE_XOAUTH2:
        pSVar15 = conn->data;
        local_58 = (char *)0x0;
        local_68 = (char *)0x0;
        if (local_6c != 0x2b) goto LAB_0048842a;
        CVar6 = Curl_sasl_create_xoauth2_message
                          (pSVar15,conn->user,conn->xoauth2_bearer,&local_68,(size_t *)&local_58);
LAB_004883eb:
        if ((local_68 != (char *)0x0 && CVar6 == CURLE_OK) &&
           (CVar6 = Curl_pp_sendf(&(pp->ftpc).pp,"%s"), CVar6 == CURLE_OK)) {
          (conn->proto).imapc.state = IMAP_AUTHENTICATE_FINAL;
LAB_00488640:
          CVar6 = CURLE_OK;
        }
LAB_00488509:
        if (local_68 != (char *)0x0) {
          (*Curl_cfree)(local_68);
          local_68 = (char *)0x0;
        }
        break;
      case IMAP_AUTHENTICATE_CANCEL:
        pSVar15 = conn->data;
        local_58 = (char *)0x0;
        local_68 = (char *)0x0;
        local_50 = (char *)0x0;
        local_40[0] = local_40[0] & 0xffffffff00000000;
        local_44 = POP3_STOP;
        puVar1 = &(conn->proto).pop3c.authmechs;
        *puVar1 = *puVar1 ^ (conn->proto).pop3c.authused;
        CVar6 = pop3_calc_sasl_details
                          (conn,&local_58,&local_68,(size_t *)&local_50,(pop3state *)local_40,
                           &local_44);
        if (CVar6 == CURLE_OK) {
          if (local_58 == (char *)0x0) {
            uVar12 = (conn->proto).pop3c.authtypes;
            if (((uVar12 & 2) == 0) || (((conn->proto).imapc.resptag[4] & 2U) == 0)) {
              if (((uVar12 & 1) == 0) || (((conn->proto).imapc.resptag[4] & 1U) == 0)) {
                Curl_failf(pSVar15,"Authentication cancelled");
                goto LAB_00488234;
              }
              CVar6 = pop3_perform_user(conn);
            }
            else {
              CVar6 = pop3_perform_apop(conn);
            }
          }
          else {
            CVar6 = pop3_perform_auth(conn,local_58,local_68,(size_t)local_50,(pop3state)local_40[0]
                                      ,local_44);
            if (local_68 != (char *)0x0) {
              (*Curl_cfree)(local_68);
              local_68 = (char *)0x0;
            }
          }
        }
        break;
      case IMAP_AUTHENTICATE_FINAL:
      case IMAP_LOGIN:
        if (local_6c != 0x2b) goto LAB_00488464;
        goto switchD_00487d24_caseD_4;
      case IMAP_LIST:
        if (local_6c == 0x2b) {
          pcVar14 = conn->passwd;
          if (pcVar14 == (char *)0x0) {
            pcVar14 = "";
          }
          CVar6 = Curl_pp_sendf(&(pp->ftpc).pp,"PASS %s",pcVar14);
        }
        else {
          Curl_failf(conn->data,"Access denied. %c",(ulong)local_6c);
          CVar6 = CURLE_LOGIN_DENIED;
        }
        if (CVar6 == CURLE_OK) {
          (conn->proto).imapc.state = IMAP_SELECT;
        }
        break;
      case IMAP_SELECT:
        if (local_6c != 0x2b) {
          pSVar15 = conn->data;
          pcVar14 = "Access denied. %c";
          goto LAB_004884c8;
        }
switchD_00487d24_caseD_4:
        (conn->proto).imapc.state = IMAP_STOP;
LAB_00488253:
        CVar6 = CURLE_OK;
        break;
      case IMAP_FETCH:
        if (local_6c == 0x2b) {
          pSVar15 = conn->data;
          piVar4 = (int *)(pSVar15->req).protop;
          (conn->proto).pop3c.eob = 2;
          (conn->proto).pop3c.strip = 2;
          if (*piVar4 == 0) {
            Curl_setup_transfer(conn,0,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
            pcVar14 = (conn->proto).ftpc.pp.cache;
            if (pcVar14 != (char *)0x0) {
              if (((pSVar15->set).opt_no_body == false) &&
                 (CVar6 = Curl_pop3_write(conn,pcVar14,(conn->proto).rtspc.rtp_bufsize),
                 CVar6 != CURLE_OK)) break;
              pcVar14 = (pp->ftpc).pp.cache;
              if (pcVar14 != (char *)0x0) {
                (*Curl_cfree)(pcVar14);
                (pp->ftpc).pp.cache = (char *)0x0;
              }
              (conn->proto).ftpc.pp.cache_size = 0;
            }
          }
          (conn->proto).imapc.state = IMAP_STOP;
          CVar6 = CURLE_OK;
        }
        else {
          (conn->proto).imapc.state = IMAP_STOP;
          CVar6 = CURLE_RECV_ERROR;
        }
      }
LAB_0048879d:
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      if ((conn->proto).imapc.state == IMAP_STOP) {
        return CURLE_OK;
      }
      _Var5 = Curl_pp_moredata(&(pp->ftpc).pp);
      CVar6 = CURLE_OK;
    } while (_Var5);
  }
  return CVar6;
}

Assistant:

static CURLcode pop3_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int pop3code;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  struct pingpong *pp = &pop3c->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not POP3 */
  if(pop3c->state == POP3_UPGRADETLS)
    return pop3_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

 do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &pop3code, &nread);
    if(result)
      return result;

    if(!pop3code)
      break;

    /* We have now received a full POP3 server response */
    switch(pop3c->state) {
    case POP3_SERVERGREET:
      result = pop3_state_servergreet_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_CAPA:
      result = pop3_state_capa_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_STARTTLS:
      result = pop3_state_starttls_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_PLAIN:
      result = pop3_state_auth_plain_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_LOGIN:
      result = pop3_state_auth_login_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_LOGIN_PASSWD:
      result = pop3_state_auth_login_password_resp(conn, pop3code,
                                                   pop3c->state);
      break;

#ifndef CURL_DISABLE_CRYPTO_AUTH
    case POP3_AUTH_CRAMMD5:
      result = pop3_state_auth_cram_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_DIGESTMD5:
      result = pop3_state_auth_digest_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_DIGESTMD5_RESP:
      result = pop3_state_auth_digest_resp_resp(conn, pop3code, pop3c->state);
      break;
#endif

#ifdef USE_NTLM
    case POP3_AUTH_NTLM:
      result = pop3_state_auth_ntlm_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_NTLM_TYPE2MSG:
      result = pop3_state_auth_ntlm_type2msg_resp(conn, pop3code,
                                                  pop3c->state);
      break;
#endif

#if defined(USE_WINDOWS_SSPI)
    case POP3_AUTH_GSSAPI:
      result = pop3_state_auth_gssapi_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_GSSAPI_TOKEN:
      result = pop3_state_auth_gssapi_token_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_GSSAPI_NO_DATA:
      result = pop3_state_auth_gssapi_no_data_resp(conn, pop3code,
                                                   pop3c->state);
      break;
#endif

    case POP3_AUTH_XOAUTH2:
      result = pop3_state_auth_xoauth2_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_CANCEL:
      result = pop3_state_auth_cancel_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_FINAL:
      result = pop3_state_auth_final_resp(conn, pop3code, pop3c->state);
      break;

#ifndef CURL_DISABLE_CRYPTO_AUTH
    case POP3_APOP:
      result = pop3_state_apop_resp(conn, pop3code, pop3c->state);
      break;
#endif

    case POP3_USER:
      result = pop3_state_user_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_PASS:
      result = pop3_state_pass_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_COMMAND:
      result = pop3_state_command_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_QUIT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, POP3_STOP);
      break;
    }
  } while(!result && pop3c->state != POP3_STOP && Curl_pp_moredata(pp));

  return result;
}